

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border_agent.cpp
# Opt level: O0

uint32_t __thiscall ot::commissioner::BorderAgent::State::operator_cast_to_unsigned_int(State *this)

{
  State *this_local;
  
  return (uint)(*(ushort *)this & 7) << 6 | (uint)(*(ushort *)this >> 3 & 3) << 4 |
         (uint)(*(ushort *)this >> 5 & 3) << 2 | (uint)(*(ushort *)this >> 7 & 1) << 1 |
         (uint)(*(ushort *)this >> 8 & 1);
}

Assistant:

BorderAgent::State::operator uint32_t() const
{
    return ((mConnectionMode << kConnectionModeOffset) & kConnectionModeMask) |
           ((mThreadIfStatus << kThreadIfStatusOffset) & kThreadIfStatusMask) |
           ((mAvailability << kAvailabilityOffset) & kAvailabilityMask) |
           ((mBbrIsActive << kBbrIsActiveOffset) & kBbrIsActiveMask) | (mBbrIsPrimary & kBbrIsPrimaryMask);
}